

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O0

void __thiscall
gimage::Histogram::Histogram<unsigned_char>
          (Histogram *this,Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *image,
          int binsize)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int *piVar4;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *this_00;
  long lVar5;
  long lVar6;
  int in_EDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RDI;
  uchar v;
  int d;
  int i;
  int k;
  int width;
  Histogram *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined8 in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int local_30;
  int local_2c;
  int local_28;
  work_t local_24;
  int local_20 [3];
  int local_14;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  *(undefined4 *)&in_RDI->width = 0;
  *(undefined4 *)&in_RDI->field_0x4 = 0;
  in_RDI->depth = 0;
  in_RDI->height = 0;
  in_RDI->n = 0;
  local_20[1] = 0x100;
  local_20[0] = 0x10000;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_24 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::maxValue(in_RDI);
  piVar4 = std::min<int>(local_20,&local_24);
  piVar4 = std::max<int>(local_20 + 1,piVar4);
  local_20[2] = *piVar4 / local_14;
  setSize((Histogram *)in_RDI,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
          (int)in_stack_ffffffffffffffb8,iVar3);
  clear(in_stack_ffffffffffffffa0);
  local_28 = 0;
  while( true ) {
    this_00 = (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)(long)local_28;
    lVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10);
    if (lVar5 <= (long)this_00) break;
    local_2c = 0;
    while( true ) {
      lVar5 = (long)local_2c;
      lVar6 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10);
      if (lVar6 <= lVar5) break;
      bVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::isValid
                        (this_00,lVar5,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                        );
      if (bVar1) {
        local_30 = 0;
        while (in_stack_ffffffffffffffac = local_30,
              iVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
              in_stack_ffffffffffffffac < iVar3) {
          bVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                            (local_10,(long)local_2c,(long)local_28,local_30);
          if ((int)(uint)bVar2 < in_RDI->depth * local_14 + local_14 + -1) {
            lVar5 = (long)(int)((long)(ulong)bVar2 / (long)local_14);
            *(long *)(in_RDI->height + lVar5 * 8) = *(long *)(in_RDI->height + lVar5 * 8) + 1;
          }
          local_30 = local_30 + 1;
        }
      }
      local_2c = local_2c + 1;
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

Histogram(const Image<T> &image, int binsize=1)
    {
      w=h=bs=0;
      val=0;
      row=0;

      int width=std::max(256, std::min(65536, static_cast<int>(image.maxValue())))/binsize;
      setSize(width, 1, binsize);
      clear();

      for (int k=0; k<image.getHeight(); k++)
      {
        for (int i=0; i<image.getWidth(); i++)
        {
          if (image.isValid(i, k))
          {
            for (int d=0; d<image.getDepth(); d++)
            {
              T v=image.get(i, k, d);

              if (v < w*binsize+binsize-1)
              {
                val[static_cast<int>(v)/binsize]++;
              }
            }
          }
        }
      }
    }